

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

void adt_list_insert_unique(adt_list_t *self,void *pItem)

{
  void **ppvVar1;
  adt_list_elem_t *pNext;
  adt_list_elem_t *pIter;
  void *pItem_local;
  adt_list_t *self_local;
  
  if (self != (adt_list_t *)0x0) {
    pNext = self->pFirst;
    do {
      if (pNext == (adt_list_elem_t *)0x0) {
        adt_list_insert(self,pItem);
        return;
      }
      ppvVar1 = &pNext->pItem;
      pNext = pNext->pNext;
    } while (*ppvVar1 != pItem);
  }
  return;
}

Assistant:

void adt_list_insert_unique(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *pIter = self->pFirst; //create a local iterator
      while( pIter != 0 )
      {
         adt_list_elem_t *pNext = pIter->pNext;
         if (pIter->pItem == pItem)
         {
            return; //pItem already in list
         }
         pIter=pNext;
      }
      adt_list_insert(self, pItem);
   }
}